

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeThumbAddrModeRR(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t RegNo;
  uint32_t RegNo_00;
  DecodeStatus DVar2;
  uint Rm;
  uint Rn;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Val_local;
  MCInst *Inst_local;
  
  Rm = 3;
  _Rn = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Val;
  pMStack_18 = Inst;
  RegNo = fieldFromInstruction_4(Val,0,3);
  RegNo_00 = fieldFromInstruction_4(Address_local._4_4_,3,3);
  DVar2 = DecodetGPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rn);
  _Var1 = Check(&Rm,DVar2);
  if (_Var1) {
    DVar2 = DecodetGPRRegisterClass(pMStack_18,RegNo_00,(uint64_t)Decoder_local,_Rn);
    _Var1 = Check(&Rm,DVar2);
    if (_Var1) {
      Inst_local._4_4_ = Rm;
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeThumbAddrModeRR(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Val, 0, 3);
	unsigned Rm = fieldFromInstruction_4(Val, 3, 3);

	if (!Check(&S, DecodetGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodetGPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}